

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseString(char *String,size_t StringLength,_Bool IsBareWord,_Bool AllowNewLines,
                     size_t *pAmountProcessed,char **pProcessedString)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_88;
  size_t numExtraCharsRead;
  char nextNextChar;
  char nextChar;
  char *pcStack_78;
  char currentChar;
  size_t i_2;
  size_t strPos;
  size_t i_1;
  size_t i;
  char *pcStack_50;
  _Bool singleQuoted;
  char *processedString;
  size_t strEndPos;
  size_t strLength;
  char **ppcStack_30;
  JL_STATUS jlStatus;
  char **pProcessedString_local;
  size_t *pAmountProcessed_local;
  _Bool AllowNewLines_local;
  size_t sStack_18;
  _Bool IsBareWord_local;
  size_t StringLength_local;
  char *String_local;
  
  strEndPos = 0;
  processedString = (char *)0x0;
  pcStack_50 = (char *)0x0;
  i._7_1_ = *String == '\'';
  strLength._4_4_ = JL_STATUS_INVALID_DATA;
  if (IsBareWord) {
    for (i_1 = 0; i_1 < StringLength; i_1 = i_1 + 1) {
      processedString = (char *)i_1;
      if (String[i_1] == '\\') {
        i_1 = i_1 + 1;
        strEndPos = strEndPos + 1;
      }
      else {
        if ((((String[i_1] != '_') && (String[i_1] != '$')) &&
            (((String[i_1] < 'a' || ('z' < String[i_1])) &&
             ((String[i_1] < 'A' || ('Z' < String[i_1])))))) &&
           ((String[i_1] < '0' || ('9' < String[i_1])))) break;
        strLength._4_4_ = JL_STATUS_SUCCESS;
      }
      strEndPos = strEndPos + 1;
    }
  }
  else {
    for (strPos = 1; strPos < StringLength; strPos = strPos + 1) {
      processedString = (char *)strPos;
      if (String[strPos] == '\\') {
        sVar1 = strPos + 1;
        sVar2 = strEndPos + 1;
        if (((AllowNewLines) && (String[sVar1] == '\r')) && (String[strPos + 2] == '\n')) {
          sVar1 = strPos + 2;
          sVar2 = strEndPos + 2;
        }
      }
      else {
        if (((!(bool)i._7_1_) && (String[strPos] == '\"')) ||
           (((bool)i._7_1_ && (String[strPos] == '\'')))) {
          strLength._4_4_ = JL_STATUS_SUCCESS;
          break;
        }
        sVar1 = strPos;
        sVar2 = strEndPos;
        if (String[strPos] < ' ') {
          strLength._4_4_ = JL_STATUS_INVALID_DATA;
          *pAmountProcessed = strPos;
          break;
        }
      }
      strEndPos = sVar2;
      strPos = sVar1;
      strEndPos = strEndPos + 1;
    }
  }
  if (strLength._4_4_ == JL_STATUS_SUCCESS) {
    i_2 = 0;
    ppcStack_30 = pProcessedString;
    pProcessedString_local = (char **)pAmountProcessed;
    pAmountProcessed_local._6_1_ = AllowNewLines;
    pAmountProcessed_local._7_1_ = IsBareWord;
    sStack_18 = StringLength;
    StringLength_local = (size_t)String;
    pcStack_50 = (char *)WjTestLib_Calloc(strEndPos + 1,1);
    if (pcStack_50 == (char *)0x0) {
      strLength._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      for (pcStack_78 = (char *)(long)(int)(uint)((pAmountProcessed_local._7_1_ & 1) == 0);
          pcStack_78 < processedString; pcStack_78 = pcStack_78 + 1) {
        numExtraCharsRead._7_1_ = pcStack_78[StringLength_local];
        if (numExtraCharsRead._7_1_ == '\\') {
          numExtraCharsRead._6_1_ = pcStack_78[StringLength_local + 1];
          numExtraCharsRead._5_1_ = pcStack_78[StringLength_local + 2];
          if (numExtraCharsRead._6_1_ == 'n') {
            pcStack_50[i_2] = '\n';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == 'r') {
            pcStack_50[i_2] = '\r';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == 'f') {
            pcStack_50[i_2] = '\f';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == 'b') {
            pcStack_50[i_2] = '\b';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == 't') {
            pcStack_50[i_2] = '\t';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == '\\') {
            pcStack_50[i_2] = '\\';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == '/') {
            pcStack_50[i_2] = '/';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == '\"') {
            pcStack_50[i_2] = '\"';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == '\'') {
            pcStack_50[i_2] = '\'';
            i_2 = i_2 + 1;
          }
          else if (numExtraCharsRead._6_1_ == 'u') {
            local_88 = 0;
            strLength._4_4_ =
                 ConvertEscapedUnicode
                           (pcStack_78 + StringLength_local + 2,(strEndPos - (long)pcStack_78) - 1,
                            pcStack_50,&i_2,&local_88);
            if (strLength._4_4_ != JL_STATUS_SUCCESS) {
              *pProcessedString_local = pcStack_78;
              break;
            }
            pcStack_78 = pcStack_78 + local_88;
          }
          else {
            if (((pAmountProcessed_local._6_1_ & 1) == 0) ||
               ((numExtraCharsRead._6_1_ != '\r' && (numExtraCharsRead._6_1_ != '\n')))) {
              strLength._4_4_ = JL_STATUS_INVALID_DATA;
              *pProcessedString_local = pcStack_78;
              break;
            }
            if ((numExtraCharsRead._6_1_ == '\r') && (numExtraCharsRead._5_1_ == '\n')) {
              pcStack_78 = pcStack_78 + 1;
            }
          }
          pcStack_78 = pcStack_78 + 1;
        }
        else {
          pcStack_50[i_2] = numExtraCharsRead._7_1_;
          i_2 = i_2 + 1;
        }
      }
      if (strLength._4_4_ == JL_STATUS_SUCCESS) {
        *ppcStack_30 = pcStack_50;
        *pProcessedString_local =
             processedString + (int)(uint)((pAmountProcessed_local._7_1_ & 1) == 0);
      }
      else {
        WjTestLib_Free(pcStack_50);
      }
    }
  }
  return strLength._4_4_;
}

Assistant:

static
JL_STATUS
    ParseString
    (
        char const*         String,
        size_t              StringLength,
        bool                IsBareWord,
        bool                AllowNewLines,
        size_t*             pAmountProcessed,
        char**              pProcessedString
    )
{
    JL_STATUS jlStatus;
    size_t strLength = 0;
    size_t strEndPos = 0;
    char* processedString = NULL;
    bool singleQuoted = '\'' == String[0] ? true : false;

    // Find end of string
    jlStatus = JL_STATUS_INVALID_DATA;
    if( IsBareWord )
    {
        // Find length of bareword. Simply scan through until we find a non valid bareword char
        for( size_t i=0; i<StringLength; i++ )
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
            }
            else if ( '_' == String[i] || '$' == String[i]
                      || ( String[i] >= 'a' && String[i] <= 'z' )
                      || ( String[i] >= 'A' && String[i] <= 'Z' )
                      || ( String[i] >= '0' && String[i] <= '9' ) )
            {
                jlStatus = JL_STATUS_SUCCESS;   // At least one character
            }
            else
            {
                // End of bareword
                break;
            }
            strLength += 1;
        }
    }
    else
    {
        // Quoted string. Find the length
        for( size_t i=1; i<StringLength; i++ )      // Start at 1 to skip the first double quote
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
                if( AllowNewLines )
                {
                    // Check if we are escaping a crlf sequence
                    if( '\r' == String[i] && '\n' == String[i+1] )
                    {
                        i += 1;
                        strLength += 1;
                    }
                }
            }
            else if(    ( !singleQuoted && '\"' == String[i] )
                     || (  singleQuoted && '\'' == String[i] ) )
            {
                jlStatus = JL_STATUS_SUCCESS;
                break;
            }
            else if( String[i] < 32 )
            {
                // Control chars not allowed.
                jlStatus = JL_STATUS_INVALID_DATA;
                *pAmountProcessed = i;
                break;
            }
            strLength += 1;
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Allocate space for processed string
        size_t strPos = 0;
        processedString = JlAlloc( strLength + 1 );
        if( NULL != processedString )
        {
            // Process string
            for( size_t i=IsBareWord?0:1; i<strEndPos; i++ )     // Skip first char which is double quote unless IsBareWord true
            {
                char currentChar = String[i];

                if( '\\' == currentChar )
                {
                    // Escaped chars. (There will definitely be at least one character after this
                    // due to the way we parsed in previous loop)
                    char nextChar = String[i+1];
                    char nextNextChar = String[i+2];
                    if( 'n' == nextChar )
                    {
                        processedString[strPos] = '\n';
                        strPos += 1;
                    }
                    else if( 'r' == nextChar )
                    {
                        processedString[strPos] = '\r';
                        strPos += 1;
                    }
                    else if( 'f' == nextChar )
                    {
                        processedString[strPos] = '\f';
                        strPos += 1;
                    }
                    else if( 'b' == nextChar )
                    {
                        processedString[strPos] = '\b';
                        strPos += 1;
                    }
                    else if( 't' == nextChar )
                    {
                        processedString[strPos] = '\t';
                        strPos += 1;
                    }
                    else if( '\\' == nextChar )
                    {
                        processedString[strPos] = '\\';
                        strPos += 1;
                    }
                    else if( '/' == nextChar )
                    {
                        processedString[strPos] = '/';
                        strPos += 1;
                    }
                    else if( '\"' == nextChar )
                    {
                        processedString[strPos] = '\"';
                        strPos += 1;
                    }
                    else if( '\'' == nextChar )
                    {
                        processedString[strPos] = '\'';
                        strPos += 1;
                    }
                    else if( 'u' == nextChar )
                    {
                        size_t numExtraCharsRead = 0;
                        // attempt to convert the escaped unicode value.
                        jlStatus = ConvertEscapedUnicode( String+i+2, strLength-i-1, processedString, &strPos, &numExtraCharsRead );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            // skip the processed chars (note this is after the \u, we will also skip the \u part later)
                            // numCharsRead will be either 4 or 10 depending whether surrogate pairs were used/
                            i += numExtraCharsRead;
                        }
                        else
                        {
                            *pAmountProcessed = i;
                            break;
                        }
                    }
                    else if( AllowNewLines && ( '\r' == nextChar || '\n' == nextChar ) )
                    {
                        // Escaped new lines are allowed, they get discarded
                        if( '\r' == nextChar && '\n' == nextNextChar )
                        {
                            // the Windows CR/LF was escaped without a separate escape for the \n
                            i += 1;  // skip the extra one
                        }
                    }
                    else
                    {
                        // Invalid escape char
                        jlStatus = JL_STATUS_INVALID_DATA;
                        *pAmountProcessed = i;
                        break;
                    }
                    i += 1;  // Skip the char after the initial backslash as we have processed it
                }
                else
                {
                    processedString[strPos] = currentChar;
                    strPos += 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pProcessedString = processedString;
                *pAmountProcessed = strEndPos + (IsBareWord ? 0 : 1);     // If not bareword then also skip the ending quote
            }
            else
            {
                JlFree( processedString );
            }
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }

    return jlStatus;
}